

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_null(void)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bson_t *bcon;
  
  uVar2 = bson_bcon_magic();
  uVar2 = bcon_new(0,"foo",uVar2,9);
  uVar3 = bson_bcone_magic();
  bVar1 = bcon_extract(uVar2,"foo",uVar3,9,0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x87,"test_null","BCON_EXTRACT (bcon, \"foo\", BCONE_NULL)");
    abort();
  }
  bson_destroy(uVar2);
  return;
}

Assistant:

static void
test_null (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_null (&expected, "foo", -1);

   BCON_APPEND (&bcon, "foo", BCON_NULL);

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}